

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void term_invalidate(Terminal *term)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar2 = (ulong)(uint)term->rows;
  if (term->rows < L'\x01') {
    uVar2 = 0;
  }
  for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    uVar4 = (ulong)(uint)term->cols;
    if (term->cols < L'\x01') {
      uVar4 = 0;
    }
    for (lVar5 = 0; uVar4 * 0x20 != lVar5; lVar5 = lVar5 + 0x20) {
      puVar1 = (ulong *)((long)&term->disptext[uVar3]->chars->attr + lVar5);
      *puVar1 = *puVar1 | 0x3ffff;
    }
  }
  if (term->window_update_pending != false) {
    return;
  }
  term->window_update_pending = true;
  queue_toplevel_callback(term_update_callback,term);
  return;
}

Assistant:

void term_invalidate(Terminal *term)
{
    int i, j;

    for (i = 0; i < term->rows; i++)
        for (j = 0; j < term->cols; j++)
            term->disptext[i]->chars[j].attr |= ATTR_INVALID;

    term_schedule_update(term);
}